

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O2

bool __thiscall CLOParser::getBool(CLOParser *this,char *names,bool *result)

{
  bool bVar1;
  istream *piVar2;
  bool bVar3;
  bool bVar4;
  string buffer;
  string keyword;
  string negOptions;
  string longOptions;
  string shortOptions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  istringstream iss;
  
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  shortOptions._M_dataplus._M_p = (pointer)&shortOptions.field_2;
  shortOptions._M_string_length = 0;
  longOptions._M_dataplus._M_p = (pointer)&longOptions.field_2;
  longOptions._M_string_length = 0;
  shortOptions.field_2._M_local_buf[0] = '\0';
  longOptions.field_2._M_local_buf[0] = '\0';
  negOptions._M_dataplus._M_p = (pointer)&negOptions.field_2;
  negOptions._M_string_length = 0;
  negOptions.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&keyword,names,(allocator *)&local_1d0);
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&keyword,_S_in);
  std::__cxx11::string::~string((string *)&keyword);
  keyword._M_dataplus._M_p = (pointer)&keyword.field_2;
  keyword._M_string_length = 0;
  keyword.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::operator>>((istream *)&iss,(string *)&keyword);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    if (keyword._M_string_length < 3) {
      if (shortOptions._M_string_length != 0) {
        std::__cxx11::string::append((char *)&shortOptions);
      }
      std::__cxx11::string::append((string *)&shortOptions);
    }
    else {
      if (longOptions._M_string_length != 0) {
        std::__cxx11::string::append((char *)&longOptions);
      }
      std::__cxx11::string::append((string *)&longOptions);
      if ((*keyword._M_dataplus._M_p == '-') && (keyword._M_dataplus._M_p[1] == '-')) {
        if (negOptions._M_string_length != 0) {
          std::__cxx11::string::append((char *)&negOptions);
        }
        std::__cxx11::string::substr((ulong)&local_1f0,(ulong)&keyword);
        std::operator+(&local_1d0,"--no",&local_1f0);
        std::__cxx11::string::append((string *)&negOptions);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1f0);
      }
    }
  }
  bVar1 = getOption<int>(this,shortOptions._M_dataplus._M_p,(int *)0x0,false);
  bVar4 = true;
  bVar3 = true;
  if (!bVar1) {
    bVar1 = getOption<int>(this,negOptions._M_dataplus._M_p,(int *)0x0,false);
    if (bVar1) goto LAB_00199732;
    bVar1 = getOption<std::__cxx11::string>(this,longOptions._M_dataplus._M_p,&buffer,false);
    if (!bVar1) {
      bVar4 = false;
      goto LAB_0019973b;
    }
    bVar3 = true;
    if (buffer._M_string_length != 0) {
      bVar1 = std::operator==(&buffer,"true");
      bVar3 = true;
      if (!bVar1) {
        bVar1 = std::operator==(&buffer,"on");
        bVar3 = true;
        if (!bVar1) {
          bVar1 = std::operator==(&buffer,"1");
          bVar3 = true;
          if (!bVar1) {
            bVar1 = std::operator==(&buffer,"false");
            if (!bVar1) {
              bVar1 = std::operator==(&buffer,"off");
              if (!bVar1) {
                bVar1 = std::operator==(&buffer,"0");
                if (!bVar1) {
                  *this->i = *this->i + -1;
                  bVar3 = true;
                  goto LAB_00199734;
                }
              }
            }
LAB_00199732:
            bVar3 = false;
          }
        }
      }
    }
  }
LAB_00199734:
  *result = bVar3;
LAB_0019973b:
  std::__cxx11::string::~string((string *)&keyword);
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  std::__cxx11::string::~string((string *)&negOptions);
  std::__cxx11::string::~string((string *)&longOptions);
  std::__cxx11::string::~string((string *)&shortOptions);
  std::__cxx11::string::~string((string *)&buffer);
  return bVar4;
}

Assistant:

inline bool getBool(const char* names, bool& result) {
		std::string buffer;
		std::string shortOptions;
		std::string longOptions;
		std::string negOptions;
		std::istringstream iss(names);
		std::string keyword;
		while (iss >> keyword) {
			if (keyword.size() <= 2) {
				if (!shortOptions.empty()) {
					shortOptions += " ";
				}
				shortOptions += keyword;
			} else {
				if (!longOptions.empty()) {
					longOptions += " ";
				}
				longOptions += keyword;
				if (keyword[0] == '-' && keyword[1] == '-') {
					if (!negOptions.empty()) {
						negOptions += " ";
					}
					negOptions += "--no" + keyword.substr(1);
				}
			}
		}

		if (getOption(shortOptions.c_str())) {
			result = true;
			return true;
		}
		if (getOption(negOptions.c_str())) {
			result = false;
			return true;
		}

		if (getOption(longOptions.c_str(), &buffer)) {
			if (buffer.empty() || (buffer == "true" || buffer == "on" || buffer == "1")) {
				result = true;
			} else if (buffer == "false" || buffer == "off" || buffer == "0") {
				result = false;
			} else {
				--i;
				result = true;
			}
			return true;
		}
		return false;
	}